

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall PowerPos<0,_0,_0>::propagate_x(PowerPos<0,_0,_0> *this)

{
  IntVar *pIVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int64_t m_v;
  long lVar9;
  double dVar10;
  
  dVar10 = pow((double)(((this->z).var)->min).v,1.0 / (double)(((this->y).var)->max).v);
  dVar10 = ceil(dVar10);
  lVar4 = (long)dVar10;
  lVar5 = (long)(((this->x).var)->min).v;
  if (lVar5 < lVar4) {
    pIVar1 = (this->z).var;
    lVar9 = lVar4 + -1;
    iVar2 = (((this->y).var)->max).v;
    if ((long)iVar2 == 0) {
      lVar8 = 1;
    }
    else if (lVar9 == 0) {
      lVar8 = 0;
    }
    else {
      lVar8 = lVar9;
      if (1 < iVar2) {
        lVar7 = (long)iVar2 + -1;
        do {
          lVar8 = lVar8 * lVar9;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
    }
    if (lVar8 < (pIVar1->min).v) {
      lVar9 = lVar4;
    }
    if (lVar5 < lVar9) {
      if (so.lazy == true) {
        iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[8])();
        uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar6 = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
      }
      else {
        uVar6 = 0;
      }
      pIVar1 = (this->x).var;
      iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,lVar9,uVar6,1);
      if ((char)iVar2 == '\0') {
        return false;
      }
    }
  }
  dVar10 = pow((double)(((this->z).var)->max).v,1.0 / (double)(((this->y).var)->min).v);
  dVar10 = floor(dVar10);
  lVar4 = (long)dVar10;
  lVar5 = (long)(((this->x).var)->max).v;
  if (lVar5 <= lVar4) {
    return true;
  }
  pIVar1 = (this->z).var;
  lVar9 = lVar4 + 1;
  iVar2 = (((this->y).var)->min).v;
  if ((long)iVar2 == 0) {
    lVar8 = 1;
  }
  else if (lVar9 == 0) {
    lVar8 = 0;
  }
  else {
    lVar8 = lVar9;
    if (1 < iVar2) {
      lVar7 = (long)iVar2 + -1;
      do {
        lVar8 = lVar8 * lVar9;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
  }
  if ((pIVar1->max).v < lVar8) {
    lVar9 = lVar4;
  }
  if (lVar9 < lVar5) {
    if (so.lazy == true) {
      iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[9])();
      uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
    }
    else {
      uVar6 = 0;
    }
    pIVar1 = (this->x).var;
    iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,lVar9,uVar6,1);
    if ((char)iVar2 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate_x() {
		// Propagation on the lower bound
		double pow_res;
		pow_res = pow(z.getMin(), 1 / (double)y.getMax());
		int64_t x_min_new = static_cast<int64_t>(ceil(pow_res));
		if (x_min_new > x.getMin()) {
			// Check for numerical errors and correct them
			if (z.getMin() <= my_pow(x_min_new - 1, y.getMax())) {
				x_min_new--;
			}
			setDom(x, setMin, x_min_new, z.getMinLit(), y.getMaxLit());
		}
		// Propagation on the upper bound
		pow_res = pow(z.getMax(), 1 / (double)y.getMin());
		int64_t x_max_new = static_cast<int64_t>(floor(pow_res));
		if (x_max_new < x.getMax()) {
			// Check for numerical errors and correct them
			if (z.getMax() >= my_pow(x_max_new + 1, y.getMin())) {
				x_max_new++;
			}
			setDom(x, setMax, x_max_new, z.getMaxLit(), y.getMinLit());
		}
		return true;
	}